

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonWriter.cpp
# Opt level: O3

void __thiscall Corrade::Utility::JsonWriter::finalizeValue(JsonWriter *this)

{
  size_t count;
  char *pcVar1;
  State *pSVar2;
  Pair<unsigned_long,_unsigned_long> *pPVar3;
  char *__dest;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  
  pSVar2 = Containers::Pointer<Corrade::Utility::JsonWriter::State>::operator*(&this->_state);
  if ((pSVar2->levels)._size == 1) {
    count = (pSVar2->finalNewlineNull)._size;
    pcVar6 = (pSVar2->out)._data;
    if ((pSVar2->out)._deleter == Containers::ArrayMallocAllocator<char>::deleter) {
      sVar7 = *(long *)(pcVar6 + -8) - 8;
    }
    else {
      sVar7 = (pSVar2->out)._size;
    }
    pcVar1 = (pSVar2->finalNewlineNull)._data;
    __dest = Containers::Implementation::
             arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>(&pSVar2->out,count);
    if (count != 0) {
      uVar4 = (long)pcVar1 - (long)pcVar6;
      uVar5 = 0xffffffffffffffff;
      if (uVar4 < sVar7) {
        uVar5 = uVar4;
      }
      pcVar6 = (pSVar2->out)._data + uVar5;
      if (sVar7 <= uVar4) {
        pcVar6 = pcVar1;
      }
      memcpy(__dest,pcVar6,count);
    }
    pSVar2->expecting = DocumentEnd;
  }
  else {
    pPVar3 = Containers::
             Array<Corrade::Containers::Pair<unsigned_long,_unsigned_long>,_void_(*)(Corrade::Containers::Pair<unsigned_long,_unsigned_long>_*,_unsigned_long)>
             ::back(&pSVar2->levels);
    if (pPVar3->_second == 0xffffffffffffffff) {
      pSVar2->expecting = ObjectKeyOrEnd;
    }
    else {
      pPVar3 = Containers::
               Array<Corrade::Containers::Pair<unsigned_long,_unsigned_long>,_void_(*)(Corrade::Containers::Pair<unsigned_long,_unsigned_long>_*,_unsigned_long)>
               ::back(&pSVar2->levels);
      pPVar3->_second = pPVar3->_second + 1;
      if (pSVar2->expecting != CompactArrayValueOrArrayEnd) {
        pSVar2->expecting = ArrayValueOrArrayEnd;
      }
    }
    pSVar2->needsCommaBefore = true;
  }
  return;
}

Assistant:

void JsonWriter::finalizeValue() {
    State& state = *_state;

    /* If we're at the root or got back to it after ending an object or array,
       finalize the document */
    if(state.levels.size() == 1) {
        /* Add a \n if we're wrapping and a \0. We can't arrayRemoveSuffix() it
           to make it sentinel because that would trigger ASAN complaint when
           it gets accessed, so instead the size has to be patched in
           toString() and toFile(). */
        /** @todo drop workarounds once growable String exists */
        arrayAppend(state.out, state.finalNewlineNull);

        /* Not expecting any more JSON after this point */
        state.expecting = Expecting::DocumentEnd;

    /* Otherwise expect either an array value or an object key depending on
       where we ended up. If it's an array value, increase the array size
       counter for the value we just wrote. */
    } else if(state.levels.back().second() != ~std::size_t{}) {
        ++state.levels.back().second();
        if(state.expecting != Expecting::CompactArrayValueOrArrayEnd)
            state.expecting = Expecting::ArrayValueOrArrayEnd;
        state.needsCommaBefore = true;
    } else {
        state.expecting = Expecting::ObjectKeyOrEnd;
        state.needsCommaBefore = true;
    }
}